

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvarlengtharray.h
# Opt level: O2

bool __thiscall
QVLABase<QRhiRenderTargetAttachmentTracker::ResId>::equal<QRhiRenderTargetAttachmentTracker::ResId>
          (QVLABase<QRhiRenderTargetAttachmentTracker::ResId> *this,
          QVLABase<QRhiRenderTargetAttachmentTracker::ResId> *other)

{
  ResId *__first1;
  ResId *__first2;
  bool bVar1;
  
  __first1 = (ResId *)(this->super_QVLABaseBase).ptr;
  __first2 = (ResId *)(other->super_QVLABaseBase).ptr;
  bVar1 = std::
          __equal4<QRhiRenderTargetAttachmentTracker::ResId_const*,QRhiRenderTargetAttachmentTracker::ResId_const*>
                    (__first1,__first1 + (this->super_QVLABaseBase).s,__first2,
                     __first2 + (other->super_QVLABaseBase).s);
  return bVar1;
}

Assistant:

constexpr size_type size() const noexcept { return s; }